

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O2

_Bool sysbvm_scanner_isOperatorCharacter(int c)

{
  if ((((0x3d < c - 0x21U) || ((0x28000000f8005631U >> ((ulong)(c - 0x21U) & 0x3f) & 1) == 0)) &&
      (c != 0x7c)) && (c != 0x7e)) {
    return false;
  }
  return true;
}

Assistant:

static inline bool sysbvm_scanner_isOperatorCharacter(int c)
{
    switch(c)
    {
    case '+':
    case '-':
    case '/':
    case '\\':
    case '*':
    case '~':
    case '<':
    case '>':
    case '=':
    case '@':
    case '%':
    case '|':
    case '&':
    case '?':
    case '!':
    case '^':
        return true;
    default:
        return false;
    }
}